

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::filter_coarsen_improve
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes,Reals *cand_quals
          )

{
  Int to;
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Read<signed_char> local_1c0;
  Read<signed_char> local_1b0;
  Read<double> local_1a0;
  Read<double> local_190;
  undefined1 local_180 [8];
  Bytes keep_dirs;
  Read<int> local_160;
  Write<signed_char> local_150;
  undefined1 local_140 [8];
  Read<double> cand_old_quals;
  Read<int> local_120;
  Write<signed_char> local_110;
  undefined1 local_100 [8];
  Read<double> edge_old_quals;
  LOs edge_verts2verts;
  undefined1 local_d0 [64];
  undefined1 local_90 [8];
  Read<double> vert_old_quals;
  undefined1 local_70 [8];
  Adj verts2elems;
  Reals elem_quals;
  Reals *cand_quals_local;
  Read<signed_char> *cand_codes_local;
  LOs *cands2edges_local;
  Mesh *mesh_local;
  
  Mesh::ask_qualities((Mesh *)&verts2elems.codes.write_.shared_alloc_.direct_ptr);
  to = Mesh::dim(mesh);
  Mesh::ask_up((Adj *)local_70,mesh,0,to);
  Graph::Graph((Graph *)(local_d0 + 0x20),(Graph *)local_70);
  Read<double>::Read((Read<double> *)(local_d0 + 0x10),
                     (Read<double> *)&verts2elems.codes.write_.shared_alloc_.direct_ptr);
  graph_reduce<double>
            ((Omega_h *)local_90,(Graph *)(local_d0 + 0x20),(Read<double> *)(local_d0 + 0x10),1,
             OMEGA_H_MIN);
  Read<double>::~Read((Read<double> *)(local_d0 + 0x10));
  Graph::~Graph((Graph *)(local_d0 + 0x20));
  Read<double>::Read((Read<double> *)&edge_verts2verts.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_90);
  Mesh::sync_array<double>
            ((Mesh *)local_d0,(Int)mesh,(Read<double> *)0x0,(int)&edge_verts2verts + 8);
  Read<double>::operator=((Read<double> *)local_90,(Read<double> *)local_d0);
  Read<double>::~Read((Read<double> *)local_d0);
  Read<double>::~Read((Read<double> *)&edge_verts2verts.write_.shared_alloc_.direct_ptr);
  Mesh::ask_verts_of((Mesh *)&edge_old_quals.write_.shared_alloc_.direct_ptr,(Int)mesh);
  Read<int>::Read(&local_120,(Read<int> *)&edge_old_quals.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&cand_old_quals.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_90);
  unmap<double>((Omega_h *)&local_110,&local_120,
                (Read<signed_char> *)&cand_old_quals.write_.shared_alloc_.direct_ptr,1);
  read<double>((Omega_h *)local_100,&local_110);
  Write<double>::~Write((Write<double> *)&local_110);
  Read<double>::~Read((Read<double> *)&cand_old_quals.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_120);
  Read<int>::Read(&local_160,cands2edges);
  Read<double>::Read((Read<double> *)&keep_dirs.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_100);
  unmap<double>((Omega_h *)&local_150,&local_160,
                (Read<signed_char> *)&keep_dirs.write_.shared_alloc_.direct_ptr,2);
  read<double>((Omega_h *)local_140,&local_150);
  Write<double>::~Write((Write<double> *)&local_150);
  Read<double>::~Read((Read<double> *)&keep_dirs.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_160);
  Read<double>::Read(&local_190,cand_quals);
  Read<double>::Read(&local_1a0,(Read<double> *)local_140);
  gt_each<double>((Omega_h *)local_180,&local_190,&local_1a0);
  Read<double>::~Read(&local_1a0);
  Read<double>::~Read(&local_190);
  Read<signed_char>::Read(&local_1b0,cand_codes);
  Read<signed_char>::Read(&local_1c0,(Read<signed_char> *)local_180);
  filter_coarsen_dirs(this,&local_1b0,&local_1c0);
  Read<signed_char>::~Read(&local_1c0);
  Read<signed_char>::~Read(&local_1b0);
  Read<signed_char>::~Read((Read<signed_char> *)local_180);
  Read<double>::~Read((Read<double> *)local_140);
  Read<double>::~Read((Read<double> *)local_100);
  Read<int>::~Read((Read<int> *)&edge_old_quals.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)local_90);
  Adj::~Adj((Adj *)local_70);
  Read<double>::~Read((Read<double> *)&verts2elems.codes.write_.shared_alloc_.direct_ptr);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> filter_coarsen_improve(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes, Reals cand_quals) {
  auto elem_quals = mesh->ask_qualities();
  auto verts2elems = mesh->ask_up(VERT, mesh->dim());
  auto vert_old_quals = graph_reduce(verts2elems, elem_quals, 1, OMEGA_H_MIN);
  vert_old_quals = mesh->sync_array(VERT, vert_old_quals, 1);
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto edge_old_quals = read(unmap(edge_verts2verts, vert_old_quals, 1));
  auto cand_old_quals = read(unmap(cands2edges, edge_old_quals, 2));
  auto keep_dirs = gt_each(cand_quals, cand_old_quals);
  return filter_coarsen_dirs(cand_codes, keep_dirs);
}